

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdtls.cpp
# Opt level: O3

void QDtls::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == pskRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == handshakeTimeout && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QMetaObject::activate(_o,&staticMetaObject,1,(void **)0x0);
        return;
      }
      goto LAB_00256ca7;
    }
    if (_id == 0) {
      local_20 = *_a[1];
      local_10 = &local_20;
      local_18 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00256ca7:
  __stack_chk_fail();
}

Assistant:

void QDtls::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDtls *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pskRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 1: _t->handshakeTimeout(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QDtls::pskRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)()>(_a, &QDtls::handshakeTimeout, 1))
            return;
    }
}